

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::SaveTraceForBugreportResponse::operator==
          (SaveTraceForBugreportResponse *this,SaveTraceForBugreportResponse *other)

{
  __type_conflict4 _Var1;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if ((_Var1) && (this->success_ == other->success_)) {
    _Var1 = ::std::operator==(&this->msg_,&other->msg_);
    return _Var1;
  }
  return false;
}

Assistant:

bool SaveTraceForBugreportResponse::operator==(const SaveTraceForBugreportResponse& other) const {
  return unknown_fields_ == other.unknown_fields_
   && success_ == other.success_
   && msg_ == other.msg_;
}